

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::CountingNetworkAddress::connect
          (CountingNetworkAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_00000034;
  long lVar1;
  long local_30;
  Promise<kj::Own<kj::AsyncIoStream>_> local_28;
  long local_18;
  CountingNetworkAddress *this_local;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  **(int **)(lVar1 + 0x20) = **(int **)(lVar1 + 0x20) + 1;
  **(int **)(lVar1 + 0x40) = **(int **)(lVar1 + 0x40) + 1;
  local_18 = lVar1;
  this_local = this;
  (**(code **)**(undefined8 **)(lVar1 + 8))();
  local_30 = lVar1;
  Promise<kj::Own<kj::AsyncIoStream>>::
  then<kj::(anonymous_namespace)::CountingNetworkAddress::connect()::_lambda(kj::Own<kj::AsyncIoStream>)_1_,kj::_::PropagateException>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)this,(Type *)&local_28,
             (PropagateException *)&local_30);
  Promise<kj::Own<kj::AsyncIoStream>_>::~Promise(&local_28);
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<kj::AsyncIoStream>> connect() override {
    ++count;
    ++cumulative;
    return inner.connect()
        .then([this](kj::Own<kj::AsyncIoStream> stream) -> kj::Own<kj::AsyncIoStream> {
      return kj::heap<CountingIoStream>(kj::mv(stream), count);
    });
  }